

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_face_curve_tol(REF_GRID ref_grid,REF_INT faceid,REF_DBL *curve,REF_DBL *location)

{
  int iVar1;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  long lVar6;
  REF_INT geom;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  REF_DBL ks;
  REF_DBL kr;
  REF_DBL hmax;
  REF_DBL slop;
  REF_DBL delta_radian;
  REF_DBL s [3];
  REF_DBL r [3];
  double local_f0;
  double local_e8;
  double local_e0;
  long local_d8;
  long local_d0;
  REF_GRID local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_geom = ref_grid->geom;
  *curve = 2.0;
  *location = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  uVar5 = ref_egads_diagonal(ref_geom,-1,&local_e0);
  if (uVar5 == 0) {
    if (0 < ref_geom->max) {
      lVar6 = 0;
      local_c8 = ref_grid;
      do {
        pRVar2 = ref_geom->descr;
        if ((pRVar2[lVar6 * 6] == 2) && (pRVar2[lVar6 * 6 + 1] == faceid)) {
          iVar1 = pRVar2[lVar6 * 6 + 5];
          local_d0 = (long)iVar1;
          uVar7 = 0xffffffff;
          if (-1 < local_d0) {
            uVar7 = 0xffffffff;
            if (iVar1 < ref_geom->ref_adj->nnode) {
              uVar7 = (ulong)(uint)ref_geom->ref_adj->first[local_d0];
            }
          }
          if ((int)uVar7 != -1) {
            geom = ref_geom->ref_adj->item[(int)uVar7].ref;
            local_d0 = local_d0 * 0xf;
            local_d8 = (long)(iVar1 * 0xf);
            do {
              if (ref_geom->descr[geom * 6] == 1) {
                ref_geom_radian_request(ref_geom,geom,&local_b0);
                local_c0 = local_e0;
                local_78 = local_b0;
                uStack_70 = 0;
                uVar5 = ref_egads_face_curvature
                                  (ref_geom,(REF_INT)lVar6,&local_e8,local_48,&local_f0,local_68);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xa9e,"ref_geom_face_curve_tol",(ulong)uVar5,"curve");
                  return uVar5;
                }
                if (local_e8 <= -local_e8) {
                  local_e8 = -local_e8;
                }
                if (local_f0 <= -local_f0) {
                  local_f0 = -local_f0;
                }
                if (local_e8 <= local_f0 * 0.05) {
                  local_e8 = local_f0 * 0.05;
                }
                uStack_a0 = 0;
                if (local_f0 <= local_e8 * 0.05) {
                  local_f0 = local_e8 * 0.05;
                }
                uStack_80 = 0;
                local_98 = local_e0;
                uStack_90 = 0;
                local_a8 = local_e8;
                local_88 = local_f0;
                uVar5 = ref_geom_reliability(ref_geom,(REF_INT)lVar6,&local_b8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                         ,0xaaa,"ref_geom_face_curve_tol",(ulong)uVar5,"edge tol");
                  return uVar5;
                }
                dVar9 = 1.0 / (local_c0 / local_78);
                uVar8 = -(ulong)(dVar9 < local_a8);
                dVar10 = (double)(~uVar8 & (ulong)local_98 | (ulong)(local_78 / local_a8) & uVar8);
                if ((dVar10 < local_b8) && (dVar10 = dVar10 / local_b8, dVar10 < *curve)) {
                  *curve = dVar10;
                  pRVar3 = local_c8->node->real;
                  *location = pRVar3[local_d0];
                  location[1] = pRVar3[local_d0 + 1];
                  location[2] = pRVar3[local_d0 + 2];
                }
                uVar8 = -(ulong)(dVar9 < local_88);
                dVar9 = (double)(~uVar8 & (ulong)local_98 | (ulong)(local_78 / local_88) & uVar8);
                if ((dVar9 < local_b8) && (dVar9 = dVar9 / local_b8, dVar9 < *curve)) {
                  *curve = dVar9;
                  pRVar3 = local_c8->node->real;
                  *location = pRVar3[local_d8];
                  location[1] = pRVar3[local_d8 + 1];
                  location[2] = pRVar3[local_d8 + 2];
                }
              }
              pRVar4 = ref_geom->ref_adj->item;
              iVar1 = pRVar4[(int)uVar7].next;
              uVar7 = (ulong)iVar1;
              if (uVar7 == 0xffffffffffffffff) {
                geom = -1;
              }
              else {
                geom = pRVar4[uVar7].ref;
              }
            } while (iVar1 != -1);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < ref_geom->max);
    }
    uVar5 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xa94,
           "ref_geom_face_curve_tol",(ulong)uVar5,"bbox diag");
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_face_curve_tol(REF_GRID ref_grid,
                                                  REF_INT faceid,
                                                  REF_DBL *curve,
                                                  REF_DBL *location) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);

  REF_INT edge_geom, node;
  REF_INT item, face_geom;
  REF_DBL hmax, delta_radian, rlimit;
  REF_DBL kr, r[3], ks, s[3];
  REF_DBL hr, hs, slop;
  REF_DBL curvature_ratio = 1.0 / 20.0;

  *curve = 2.0;
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;

  RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "bbox diag");

  each_ref_geom_face(ref_geom, face_geom) {
    if (faceid != ref_geom_id(ref_geom, face_geom)) continue;
    node = ref_geom_node(ref_geom, face_geom);
    each_ref_geom_having_node(ref_geom, node, item, edge_geom) {
      if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) continue;
      RSS(ref_geom_radian_request(ref_geom, edge_geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      RSS(ref_egads_face_curvature(ref_geom, face_geom, &kr, r, &ks, s),
          "curve");
      /* ignore sign, k is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      RSS(ref_geom_reliability(ref_geom, face_geom, &slop), "edge tol");
      if (hr < slop) {
        if (*curve > hr / slop) {
          *curve = hr / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
      if (hs < slop) {
        if (*curve > hs / slop) {
          *curve = hs / slop;
          location[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, node);
          location[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, node);
          location[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, node);
        }
      }
    }
  }
  return REF_SUCCESS;
}